

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O3

void __thiscall
irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::createSpecialCharacterList
          (CXMLReaderImpl<char,_irr::io::IXMLBase> *this)

{
  array<irr::core::string<char>_> *this_00;
  string<char> local_28;
  
  this_00 = &this->SpecialCharacters;
  local_28.array = (char *)0x0;
  local_28.allocated = 0;
  local_28.used = 0;
  core::string<char>::operator=(&local_28,"&amp;");
  core::array<irr::core::string<char>_>::push_back(this_00,&local_28);
  if (local_28.array != (char *)0x0) {
    operator_delete__(local_28.array);
  }
  local_28.array = (char *)0x0;
  local_28.allocated = 0;
  local_28.used = 0;
  core::string<char>::operator=(&local_28,"<lt;");
  core::array<irr::core::string<char>_>::push_back(this_00,&local_28);
  if (local_28.array != (char *)0x0) {
    operator_delete__(local_28.array);
  }
  local_28.array = (char *)0x0;
  local_28.allocated = 0;
  local_28.used = 0;
  core::string<char>::operator=(&local_28,">gt;");
  core::array<irr::core::string<char>_>::push_back(this_00,&local_28);
  if (local_28.array != (char *)0x0) {
    operator_delete__(local_28.array);
  }
  local_28.array = (char *)0x0;
  local_28.allocated = 0;
  local_28.used = 0;
  core::string<char>::operator=(&local_28,"\"quot;");
  core::array<irr::core::string<char>_>::push_back(this_00,&local_28);
  if (local_28.array != (char *)0x0) {
    operator_delete__(local_28.array);
  }
  local_28.array = (char *)0x0;
  local_28.allocated = 0;
  local_28.used = 0;
  core::string<char>::operator=(&local_28,"\'apos;");
  core::array<irr::core::string<char>_>::push_back(this_00,&local_28);
  if (local_28.array != (char *)0x0) {
    operator_delete__(local_28.array);
  }
  return;
}

Assistant:

void createSpecialCharacterList()
	{
		// list of strings containing special symbols, 
		// the first character is the special character,
		// the following is the symbol string without trailing &.

		SpecialCharacters.push_back("&amp;");
		SpecialCharacters.push_back("<lt;");
		SpecialCharacters.push_back(">gt;");
		SpecialCharacters.push_back("\"quot;");
		SpecialCharacters.push_back("'apos;");
		
	}